

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_horde_wolf(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *in_RSI;
  AFFECT_DATA *paf;
  AFFECT_DATA af;
  undefined1 in_stack_000012c2;
  undefined1 in_stack_000012c3;
  int in_stack_000012c4;
  int in_stack_000012c8;
  int in_stack_000012cc;
  CHAR_DATA *in_stack_000012d0;
  CHAR_DATA *in_stack_000012d8;
  int in_stack_000012f8;
  int in_stack_00001300;
  char *in_stack_00001308;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar4;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  char *format;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *ch_00;
  
  bVar1 = is_affected(in_RSI,(int)gsn_rage);
  if ((bVar1) && (in_RSI->fighting != (CHAR_DATA *)0x0)) {
    iVar2 = number_percent();
    iVar3 = get_skill((CHAR_DATA *)af.name,af.owner._4_4_);
    if ((double)iVar2 <= (double)iVar3 * 0.18) {
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      ch_00 = in_RSI;
      dice(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      uVar4 = 0;
      uVar5 = 0;
      uVar6 = 1;
      format = "bite";
      damage_new(in_stack_000012d8,in_stack_000012d0,in_stack_000012cc,in_stack_000012c8,
                 in_stack_000012c4,(bool)in_stack_000012c3,(bool)in_stack_000012c2,in_stack_000012f8
                 ,in_stack_00001300,in_stack_00001308);
      if (in_RSI->fighting != (CHAR_DATA *)0x0) {
        bVar1 = is_affected(in_RSI->fighting,(int)gsn_bleeding);
        if (!bVar1) {
          init_affect((AFFECT_DATA *)0x6647d4);
          new_affect_to_char(ch_00,in_stack_ffffffffffffff68);
        }
        bVar1 = is_affected(in_RSI->fighting,(int)gsn_mangled);
        if (!bVar1) {
          iVar2 = number_percent();
          paf = (AFFECT_DATA *)(double)iVar2;
          iVar2 = get_skill((CHAR_DATA *)af.name,af.owner._4_4_);
          if ((double)paf < (double)iVar2 * 0.28) {
            init_affect((AFFECT_DATA *)0x6648d5);
            new_affect_to_char(ch_00,paf);
            act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,uVar6),
                (void *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
                (void *)CONCAT44(in_stack_ffffffffffffff4c,uVar4),0);
            act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,uVar6),
                (void *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
                (void *)CONCAT44(in_stack_ffffffffffffff4c,uVar4),0);
            act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,uVar6),
                (void *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
                (void *)CONCAT44(in_stack_ffffffffffffff4c,uVar4),0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void fight_prog_horde_wolf(OBJ_DATA *obj, CHAR_DATA *ch)
{
	AFFECT_DATA af;

	if (!is_affected(ch, gsn_rage) || !ch->fighting || number_percent() > (.18 * get_skill(ch, gsn_rage)))
		return;

	act("The spirit of the Wolf enrages you as you leap at $N and sink your fangs into $S throat!", ch, 0, ch->fighting, TO_CHAR);
	act("$n gets a wild look in $s eyes and leaps at $N, sinking $s teeth into $S throat!", ch, 0, ch->fighting, TO_NOTVICT);
	act("$n gets a wild look in $s eyes and leaps at you, sinking $s teeth into your throat!", ch, 0, ch->fighting, TO_VICT);
	damage_new(ch, ch->fighting, dice(ch->level, 2), TYPE_UNDEFINED, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "bite");

	if (!ch->fighting)
		return;

	if (!is_affected(ch->fighting, gsn_bleeding))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_bleeding;
		af.aftype = AFT_INVIS;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.level = ch->level - 5;
		af.duration = ch->level / 10;
		af.owner = ch;
		af.end_fun = nullptr;
		new_affect_to_char(ch->fighting, &af);
	}

	if (!is_affected(ch->fighting, gsn_mangled) && number_percent() < (get_skill(ch, gsn_rage) * .28))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_mangled;
		af.aftype = AFT_MALADY;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.level = ch->level - 5;
		af.duration = ch->level / 18;
		af.owner = ch;
		af.end_fun = nullptr;
		new_affect_to_char(ch->fighting, &af);

		act("You hear the satisfying crunch of bone as you tear deeply into $N's throat.", ch, 0, ch->fighting, TO_CHAR);
		act("You hear the crunch of bone as $n tears deeply into your throat.", ch, 0, ch->fighting, TO_VICT);
		act("You hear the crunch of bone as $n tears deeply into $N's throat.", ch, 0, ch->fighting, TO_NOTVICT);
	}
}